

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int mbedtls_sha512_starts_ret(mbedtls_sha512_context *ctx,int is384)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  bool bVar9;
  
  bVar9 = is384 == 0;
  ctx->total[0] = 0;
  ctx->total[1] = 0;
  uVar1 = 0xcbbb9d5dc1059ed8;
  if (bVar9) {
    uVar1 = 0x6a09e667f3bcc908;
  }
  uVar2 = 0x629a292a367cd507;
  if (bVar9) {
    uVar2 = 0xbb67ae8584caa73b;
  }
  uVar4 = 0x9159015a3070dd17;
  if (bVar9) {
    uVar4 = 0x3c6ef372fe94f82b;
  }
  uVar5 = 0x152fecd8f70e5939;
  if (bVar9) {
    uVar5 = 0xa54ff53a5f1d36f1;
  }
  uVar6 = 0x67332667ffc00b31;
  if (bVar9) {
    uVar6 = 0x510e527fade682d1;
  }
  uVar7 = 0x8eb44a8768581511;
  if (bVar9) {
    uVar7 = 0x9b05688c2b3e6c1f;
  }
  uVar3 = 0xdb0c2e0d64f98fa7;
  if (bVar9) {
    uVar3 = 0x1f83d9abfb41bd6b;
  }
  uVar8 = 0x47b5481dbefa4fa4;
  if (bVar9) {
    uVar8 = 0x5be0cd19137e2179;
  }
  ctx->state[0] = uVar1;
  ctx->state[1] = uVar2;
  ctx->state[2] = uVar4;
  ctx->state[3] = uVar5;
  ctx->state[4] = uVar6;
  ctx->state[5] = uVar7;
  ctx->state[6] = uVar3;
  ctx->state[7] = uVar8;
  ctx->is384 = is384;
  return 0;
}

Assistant:

int mbedtls_sha512_starts_ret( mbedtls_sha512_context *ctx, int is384 )
{
    SHA512_VALIDATE_RET( ctx != NULL );
#if !defined(MBEDTLS_SHA512_NO_SHA384)
    SHA512_VALIDATE_RET( is384 == 0 || is384 == 1 );
#else
    SHA512_VALIDATE_RET( is384 == 0 );
#endif

    ctx->total[0] = 0;
    ctx->total[1] = 0;

    if( is384 == 0 )
    {
        /* SHA-512 */
        ctx->state[0] = UL64(0x6A09E667F3BCC908);
        ctx->state[1] = UL64(0xBB67AE8584CAA73B);
        ctx->state[2] = UL64(0x3C6EF372FE94F82B);
        ctx->state[3] = UL64(0xA54FF53A5F1D36F1);
        ctx->state[4] = UL64(0x510E527FADE682D1);
        ctx->state[5] = UL64(0x9B05688C2B3E6C1F);
        ctx->state[6] = UL64(0x1F83D9ABFB41BD6B);
        ctx->state[7] = UL64(0x5BE0CD19137E2179);
    }
    else
    {
#if defined(MBEDTLS_SHA512_NO_SHA384)
        return( MBEDTLS_ERR_SHA512_BAD_INPUT_DATA );
#else
        /* SHA-384 */
        ctx->state[0] = UL64(0xCBBB9D5DC1059ED8);
        ctx->state[1] = UL64(0x629A292A367CD507);
        ctx->state[2] = UL64(0x9159015A3070DD17);
        ctx->state[3] = UL64(0x152FECD8F70E5939);
        ctx->state[4] = UL64(0x67332667FFC00B31);
        ctx->state[5] = UL64(0x8EB44A8768581511);
        ctx->state[6] = UL64(0xDB0C2E0D64F98FA7);
        ctx->state[7] = UL64(0x47B5481DBEFA4FA4);
#endif /* MBEDTLS_SHA512_NO_SHA384 */
    }

#if !defined(MBEDTLS_SHA512_NO_SHA384)
    ctx->is384 = is384;
#endif

    return( 0 );
}